

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O3

int stmm_find_or_add(stmm_table *table,char *key,char ***slot)

{
  stmm_table_entry **ppsVar1;
  stmm_hash_func_type p_Var2;
  stmm_compare_func_type p_Var3;
  int iVar4;
  stmm_table_entry *psVar5;
  stmm_table_entry **ppsVar6;
  int iVar7;
  int local_48;
  
  p_Var2 = table->hash;
  iVar7 = (int)key;
  if (p_Var2 == stmm_ptrhash) {
    local_48 = (int)(((ulong)key >> 2) % (ulong)(long)table->num_bins);
  }
  else if (p_Var2 == stmm_numhash) {
    local_48 = -iVar7;
    if (0 < iVar7) {
      local_48 = iVar7;
    }
    local_48 = local_48 % table->num_bins;
  }
  else {
    local_48 = (*p_Var2)(key,table->num_bins);
  }
  psVar5 = table->bins[local_48];
  if (psVar5 != (stmm_table_entry *)0x0) {
    ppsVar6 = table->bins + local_48;
    do {
      p_Var3 = table->compare;
      if (p_Var3 == stmm_numcmp || p_Var3 == stmm_ptrcmp) {
        if (psVar5->key == key) {
LAB_004a07de:
          if (table->reorder_flag != 0) {
            *ppsVar6 = psVar5->next;
            ppsVar6 = table->bins;
            psVar5->next = ppsVar6[local_48];
            ppsVar6[local_48] = psVar5;
          }
          if (slot == (char ***)0x0) {
            return 1;
          }
          iVar7 = 1;
          goto LAB_004a0886;
        }
      }
      else {
        iVar4 = (*p_Var3)(key,psVar5->key);
        if (iVar4 == 0) goto LAB_004a07de;
      }
      ppsVar1 = &psVar5->next;
      ppsVar6 = &psVar5->next;
      psVar5 = *ppsVar1;
    } while (*ppsVar1 != (stmm_table_entry *)0x0);
  }
  if (table->max_density <= table->num_entries / table->num_bins) {
    iVar4 = rehash(table);
    if (iVar4 == -10000) {
      return -10000;
    }
    p_Var2 = table->hash;
    if (p_Var2 == stmm_ptrhash) {
      local_48 = (int)(((ulong)key >> 2) % (ulong)(long)table->num_bins);
    }
    else if (p_Var2 == stmm_numhash) {
      local_48 = -iVar7;
      if (0 < iVar7) {
        local_48 = iVar7;
      }
      local_48 = local_48 % table->num_bins;
    }
    else {
      local_48 = (*p_Var2)(key,table->num_bins);
    }
  }
  psVar5 = (stmm_table_entry *)Extra_MmFixedEntryFetch((Extra_MmFixed_t *)table->pMemMan);
  if (psVar5 == (stmm_table_entry *)0x0) {
    iVar4 = -10000;
  }
  else {
    psVar5->key = key;
    psVar5->record = (char *)0x0;
    ppsVar6 = table->bins;
    psVar5->next = ppsVar6[local_48];
    ppsVar6[local_48] = psVar5;
    table->num_entries = table->num_entries + 1;
    iVar4 = 0;
    iVar7 = 0;
    if (slot != (char ***)0x0) {
LAB_004a0886:
      iVar4 = iVar7;
      *slot = &psVar5->record;
    }
  }
  return iVar4;
}

Assistant:

int
stmm_find_or_add (stmm_table *table, char *key, char ***slot)
{
    int hash_val;
    stmm_table_entry *newEntry, *ptr, **last;

    hash_val = do_hash (key, table);

    FIND_ENTRY (table, hash_val, key, ptr, last);

    if (ptr == NULL) {
    if (table->num_entries / table->num_bins >= table->max_density) {
        if (rehash (table) == STMM_OUT_OF_MEM) {
        return STMM_OUT_OF_MEM;
        }
        hash_val = do_hash (key, table);
    }

    // newEntry = ABC_ALLOC( stmm_table_entry, 1 );
    newEntry = (stmm_table_entry *) Extra_MmFixedEntryFetch ((Extra_MmFixed_t *)table->pMemMan);
    if (newEntry == NULL) {
        return STMM_OUT_OF_MEM;
    }

    newEntry->key = key;
    newEntry->record = (char *) 0;
    newEntry->next = table->bins[hash_val];
    table->bins[hash_val] = newEntry;
    table->num_entries++;
    if (slot != NULL)
         *slot = &newEntry->record;
    return 0;
    }
    else {
    if (slot != NULL)
         *slot = &ptr->record;
    return 1;
    }
}